

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

char * nrv_alloc(char *s,char **rve,int n)

{
  char cVar1;
  char *local_38;
  char *t;
  char *rv;
  int n_local;
  char **rve_local;
  char *s_local;
  
  s_local = rv_alloc(n);
  local_38 = s_local;
  rve_local = (char **)s;
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    while( true ) {
      cVar1 = *(char *)rve_local;
      *local_38 = cVar1;
      if (cVar1 == '\0') break;
      local_38 = local_38 + 1;
      rve_local = (char **)((long)rve_local + 1);
    }
    if (rve != (char **)0x0) {
      *rve = local_38;
    }
  }
  return s_local;
}

Assistant:

static char *
nrv_alloc(char *s, char **rve, int n)
{
    char *rv, *t;

    rv = rv_alloc(n);
    if (rv == NULL)
        return NULL;
    t = rv;
    while((*t = *s++)) t++;
    if (rve)
        *rve = t;
    return rv;
}